

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O1

void benchmark::internal::ParseCommandLineFlags(int *argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  string *local_40 [2];
  
  if (1 < *argc) {
    iVar4 = 1;
    do {
      bVar3 = ParseBoolFlag(argv[iVar4],"benchmark_list_tests",&FLAGS_benchmark_list_tests);
      if (((((bVar3) ||
            (bVar3 = ParseStringFlag(argv[iVar4],"benchmark_filter",
                                     &FLAGS_benchmark_filter_abi_cxx11_), bVar3)) ||
           (bVar3 = ParseDoubleFlag(argv[iVar4],"benchmark_min_time",&FLAGS_benchmark_min_time),
           bVar3)) ||
          ((((bVar3 = ParseInt32Flag(argv[iVar4],"benchmark_repetitions",
                                     &FLAGS_benchmark_repetitions), bVar3 ||
             (bVar3 = ParseBoolFlag(argv[iVar4],"benchmark_report_aggregates_only",
                                    &FLAGS_benchmark_report_aggregates_only), bVar3)) ||
            ((bVar3 = ParseStringFlag(argv[iVar4],"benchmark_format",
                                      &FLAGS_benchmark_format_abi_cxx11_), bVar3 ||
             ((bVar3 = ParseStringFlag(argv[iVar4],"benchmark_out",&FLAGS_benchmark_out_abi_cxx11_),
              bVar3 || (bVar3 = ParseStringFlag(argv[iVar4],"benchmark_out_format",
                                                &FLAGS_benchmark_out_format_abi_cxx11_), bVar3))))))
           || (bVar3 = ParseBoolFlag(argv[iVar4],"color_print",&FLAGS_color_print), bVar3)))) ||
         (bVar3 = ParseInt32Flag(argv[iVar4],"v",&FLAGS_v), bVar3)) {
        iVar1 = *argc;
        if (iVar1 != iVar4) {
          lVar5 = 0;
          do {
            argv[iVar4 + lVar5] = argv[(long)iVar4 + lVar5 + 1];
            lVar5 = lVar5 + 1;
          } while (iVar1 - iVar4 != (int)lVar5);
        }
        *argc = iVar1 + -1;
        iVar4 = iVar4 + -1;
      }
      else {
        bVar3 = IsFlag(argv[iVar4],"help");
        if (bVar3) {
          PrintUsageAndExit();
          break;
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < *argc);
  }
  local_40[0] = &FLAGS_benchmark_format_abi_cxx11_;
  local_40[1] = &FLAGS_benchmark_out_format_abi_cxx11_;
  lVar5 = 0;
  while( true ) {
    pcVar2 = *(char **)((long)local_40 + lVar5);
    iVar4 = std::__cxx11::string::compare(pcVar2);
    if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare(pcVar2), iVar4 != 0)) &&
       (iVar4 = std::__cxx11::string::compare(pcVar2), iVar4 != 0)) break;
    lVar5 = lVar5 + 8;
    if (lVar5 == 0x10) {
      return;
    }
  }
  fwrite("benchmark [--benchmark_list_tests={true|false}]\n          [--benchmark_filter=<regex>]\n          [--benchmark_min_time=<min_time>]\n          [--benchmark_repetitions=<num_repetitions>]\n          [--benchmark_report_aggregates_only={true|false}\n          [--benchmark_format=<console|json|csv>]\n          [--benchmark_out=<filename>]\n          [--benchmark_out_format=<json|console|csv>]\n          [--color_print={true|false}]\n          [--v=<verbosity>]\n"
         ,0x1c6,1,_stdout);
  exit(0);
}

Assistant:

void ParseCommandLineFlags(int* argc, char** argv) {
  using namespace benchmark;
  for (int i = 1; i < *argc; ++i) {
    if (
        ParseBoolFlag(argv[i], "benchmark_list_tests",
                      &FLAGS_benchmark_list_tests) ||
        ParseStringFlag(argv[i], "benchmark_filter",
                        &FLAGS_benchmark_filter) ||
        ParseDoubleFlag(argv[i], "benchmark_min_time",
                        &FLAGS_benchmark_min_time) ||
        ParseInt32Flag(argv[i], "benchmark_repetitions",
                       &FLAGS_benchmark_repetitions) ||
        ParseBoolFlag(argv[i], "benchmark_report_aggregates_only",
                       &FLAGS_benchmark_report_aggregates_only) ||
        ParseStringFlag(argv[i], "benchmark_format",
                        &FLAGS_benchmark_format) ||
        ParseStringFlag(argv[i], "benchmark_out",
                        &FLAGS_benchmark_out) ||
        ParseStringFlag(argv[i], "benchmark_out_format",
                        &FLAGS_benchmark_out_format) ||
        ParseBoolFlag(argv[i], "color_print",
                       &FLAGS_color_print) ||
        ParseInt32Flag(argv[i], "v", &FLAGS_v)) {
      for (int j = i; j != *argc; ++j) argv[j] = argv[j + 1];

      --(*argc);
      --i;
    } else if (IsFlag(argv[i], "help")) {
      PrintUsageAndExit();
    }
  }
  for (auto const* flag : {&FLAGS_benchmark_format,
                           &FLAGS_benchmark_out_format})
  if (*flag != "console" && *flag != "json" && *flag != "csv") {
    PrintUsageAndExit();
  }
}